

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::tenaryByComponent::call
          (tenaryByComponent *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  _variable_type _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  GLuint component;
  ulong uVar9;
  uint uVar10;
  undefined8 uVar11;
  int iVar8;
  
  _Var2 = (*(this->super_tenaryBase).super_functionObject._vptr_functionObject[4])(this,0);
  uVar3 = Utils::getNumberOfComponentsForVariableType(_Var2);
  _Var2 = (*(this->super_tenaryBase).super_functionObject._vptr_functionObject[4])(this,1);
  uVar4 = Utils::getNumberOfComponentsForVariableType(_Var2);
  _Var2 = (*(this->super_tenaryBase).super_functionObject._vptr_functionObject[4])(this,2);
  uVar5 = Utils::getNumberOfComponentsForVariableType(_Var2);
  uVar10 = uVar4;
  if (uVar4 < uVar3) {
    uVar10 = uVar3;
  }
  if (uVar10 <= uVar5) {
    uVar10 = uVar5;
  }
  pcVar1 = (code *)(this->super_tenaryBase).super_functionObject.m_p_function;
  uVar9 = 0;
  do {
    uVar6 = 0;
    if (uVar3 != 1) {
      uVar6 = uVar9;
    }
    iVar7 = (int)uVar9;
    iVar8 = iVar7;
    if (uVar4 == 1) {
      iVar8 = 0;
    }
    if (uVar5 == 1) {
      iVar7 = 0;
    }
    uVar11 = (*pcVar1)(*(undefined8 *)((long)argument_src + uVar6 * 8),
                       *(undefined8 *)((long)argument_src + (ulong)(iVar8 + uVar3) * 8),
                       *(undefined8 *)((long)argument_src + (ulong)(iVar7 + uVar4 + uVar3) * 8));
    *(undefined8 *)((long)result_dst + uVar9 * 8) = uVar11;
    uVar9 = uVar9 + 1;
  } while (uVar10 != uVar9);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		glw::GLdouble*		 p_result = (glw::GLdouble*)result_dst;
		const glw::GLdouble* p_arg	= (const glw::GLdouble*)argument_src;

		const glw::GLuint n_components_0 = getArgumentComponents(0);
		const glw::GLuint n_components_1 = getArgumentComponents(1);
		const glw::GLuint n_components_2 = getArgumentComponents(2);
		const glw::GLuint n_components   = de::max(de::max(n_components_0, n_components_1), n_components_2);

		const glw::GLuint component_step_0 = (1 == n_components_0) ? 0 : 1;
		const glw::GLuint component_step_1 = (1 == n_components_1) ? 0 : 1;
		const glw::GLuint component_step_2 = (1 == n_components_2) ? 0 : 1;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLdouble first_arg  = p_arg[component * component_step_0];
			const glw::GLdouble second_arg = p_arg[component * component_step_1 + n_components_0];
			const glw::GLdouble third_arg  = p_arg[component * component_step_2 + n_components_0 + n_components_1];

			p_result[component] = p_function(first_arg, second_arg, third_arg);
		}
	}